

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

void __thiscall
aeron::archive::AeronArchive::AeronArchive
          (AeronArchive *this,Context *ctx,ArchiveProxy *archiveProxy)

{
  ArchiveProxy *archiveProxy_local;
  Context *ctx_local;
  AeronArchive *this_local;
  
  Context::Context(&this->ctx_,ctx);
  std::make_unique<aeron::archive::ArchiveProxy,aeron::archive::ArchiveProxy_const&>
            ((ArchiveProxy *)&this->archiveProxy_);
  std::
  unique_ptr<aeron::archive::ControlResponsePoller,std::default_delete<aeron::archive::ControlResponsePoller>>
  ::unique_ptr<std::default_delete<aeron::archive::ControlResponsePoller>,void>
            ((unique_ptr<aeron::archive::ControlResponsePoller,std::default_delete<aeron::archive::ControlResponsePoller>>
              *)&this->controlResponsePoller_);
  std::
  unique_ptr<aeron::archive::RecordingDescriptorPoller,std::default_delete<aeron::archive::RecordingDescriptorPoller>>
  ::unique_ptr<std::default_delete<aeron::archive::RecordingDescriptorPoller>,void>
            ((unique_ptr<aeron::archive::RecordingDescriptorPoller,std::default_delete<aeron::archive::RecordingDescriptorPoller>>
              *)&this->recordingDescriptorPoller_);
  std::shared_ptr<aeron::Aeron>::shared_ptr(&this->aeron_);
  concurrent::YieldingIdleStrategy::YieldingIdleStrategy((YieldingIdleStrategy *)&this->field_0x138)
  ;
  std::mutex::mutex(&this->lock_);
  return;
}

Assistant:

AeronArchive::AeronArchive(const Context& ctx, const ArchiveProxy& archiveProxy)
    : ctx_(ctx)
    , archiveProxy_(std::make_unique<ArchiveProxy>(archiveProxy)) {
    // TODO
}